

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O1

void anon_unknown.dwarf_23da7e::fillPixels
               (int *pImageHeight,int *pImageWidth,Array2D<half> *pPixels,int pNbChannels,
               bool pIsLeft)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  half rgbaValue [4];
  half local_38 [4];
  
  if (0 < *pImageHeight) {
    lVar1 = 0;
    lVar3 = 0;
    do {
      if (0 < *pImageWidth) {
        lVar2 = 0;
        lVar4 = 0;
        do {
          generatePixel((int)lVar3,(int)lVar4,local_38,pIsLeft);
          memcpy((void *)((long)&pPixels->_data->_h + lVar2 + pPixels->_sizeY * lVar1),local_38,
                 (ulong)(uint)pNbChannels * 2);
          lVar4 = lVar4 + 1;
          lVar2 = lVar2 + (long)pNbChannels * 2;
        } while (lVar4 < *pImageWidth);
      }
      lVar3 = lVar3 + 1;
      lVar1 = lVar1 + 2;
    } while (lVar3 < *pImageHeight);
  }
  return;
}

Assistant:

void
fillPixels (const int& pImageHeight,
            const int& pImageWidth,
            Array2D<half>& pPixels,
            int pNbChannels,
            bool pIsLeft)
{
    for(int i = 0; i < pImageHeight; ++i)
    {
        for(int j = 0; j < pImageWidth; ++j)
        {
            half rgbaValue[4];

            generatePixel(i, j, &rgbaValue[0], pIsLeft);
            memcpy( (void*)&pPixels[i][j * pNbChannels],
                    &rgbaValue[0],
                    pNbChannels * sizeof(half));
        }
    }
}